

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mfsStrash.c
# Opt level: O2

void Abc_MfsConvertHopToAig(Abc_Obj_t *pObjOld,Aig_Man_t *pMan)

{
  Hop_Man_t *p;
  anon_union_8_2_00a17ec8_for_Hop_Obj_t__0 aVar1;
  Hop_Obj_t *pHVar2;
  uint uVar3;
  Abc_Obj_t *pAVar4;
  ulong uVar5;
  long lVar6;
  Hop_Obj_t *pObj;
  
  pObj = (Hop_Obj_t *)((ulong)(pObjOld->field_5).pData & 0xfffffffffffffffe);
  uVar3 = (pObjOld->field_5).iData;
  if ((*(uint *)&pObj->field_0x20 & 7) == 1) {
    pAVar4 = (Abc_Obj_t *)((ulong)(uVar3 & 1) ^ (ulong)pMan->pConst1);
    (pObjOld->field_6).pTemp = pAVar4;
    pObjOld->pNext = pAVar4;
    return;
  }
  p = (Hop_Man_t *)pObjOld->pNtk->pManFunc;
  for (lVar6 = 0; lVar6 < (pObjOld->vFanins).nSize; lVar6 = lVar6 + 1) {
    aVar1 = *(anon_union_8_2_00a17ec8_for_Hop_Obj_t__0 *)
             ((long)pObjOld->pNtk->vObjs->pArray[(pObjOld->vFanins).pArray[lVar6]] + 0x40);
    pHVar2 = Hop_ManPi(p,(int)lVar6);
    pHVar2->field_0 = aVar1;
  }
  Abc_MfsConvertHopToAig_rec(pObj,pMan);
  uVar5 = (ulong)(uVar3 & 1);
  (pObjOld->field_6).pTemp = (void *)((ulong)(pObj->field_0).pData ^ uVar5);
  Hop_ConeUnmark_rec(pObj);
  for (lVar6 = 0; lVar6 < (pObjOld->vFanins).nSize; lVar6 = lVar6 + 1) {
    aVar1 = *(anon_union_8_2_00a17ec8_for_Hop_Obj_t__0 *)
             ((long)pObjOld->pNtk->vObjs->pArray[(pObjOld->vFanins).pArray[lVar6]] + 8);
    pHVar2 = Hop_ManPi(p,(int)lVar6);
    pHVar2->field_0 = aVar1;
  }
  Abc_MfsConvertHopToAig_rec(pObj,pMan);
  pObjOld->pNext = (Abc_Obj_t *)(uVar5 ^ (ulong)(pObj->field_0).pData);
  Hop_ConeUnmark_rec(pObj);
  return;
}

Assistant:

void Abc_MfsConvertHopToAig( Abc_Obj_t * pObjOld, Aig_Man_t * pMan )
{
    Hop_Man_t * pHopMan;
    Hop_Obj_t * pRoot;
    Abc_Obj_t * pFanin;
    int i;
    // get the local AIG
    pHopMan = (Hop_Man_t *)pObjOld->pNtk->pManFunc;
    pRoot = (Hop_Obj_t *)pObjOld->pData;
    // check the case of a constant
    if ( Hop_ObjIsConst1( Hop_Regular(pRoot) ) )
    {
        pObjOld->pCopy = (Abc_Obj_t *)Aig_NotCond( Aig_ManConst1(pMan), Hop_IsComplement(pRoot) );
        pObjOld->pNext = pObjOld->pCopy;
        return;
    }

    // assign the fanin nodes
    Abc_ObjForEachFanin( pObjOld, pFanin, i )
        Hop_ManPi(pHopMan, i)->pData = pFanin->pCopy;
    // construct the AIG
    Abc_MfsConvertHopToAig_rec( Hop_Regular(pRoot), pMan );
    pObjOld->pCopy = (Abc_Obj_t *)Aig_NotCond( (Aig_Obj_t *)Hop_Regular(pRoot)->pData, Hop_IsComplement(pRoot) );  
    Hop_ConeUnmark_rec( Hop_Regular(pRoot) );

    // assign the fanin nodes
    Abc_ObjForEachFanin( pObjOld, pFanin, i )
        Hop_ManPi(pHopMan, i)->pData = pFanin->pNext;
    // construct the AIG
    Abc_MfsConvertHopToAig_rec( Hop_Regular(pRoot), pMan );
    pObjOld->pNext = (Abc_Obj_t *)Aig_NotCond( (Aig_Obj_t *)Hop_Regular(pRoot)->pData, Hop_IsComplement(pRoot) );  
    Hop_ConeUnmark_rec( Hop_Regular(pRoot) );
}